

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

void P_GiveSecret(AActor *actor,bool printmessage,bool playsound,int sectornum)

{
  int *piVar1;
  FFont *font;
  bool bVar2;
  char *pcVar3;
  FString s;
  FSoundID local_1c;
  
  if (actor != (AActor *)0x0) {
    if (actor->player != (player_t *)0x0) {
      piVar1 = &actor->player->secretcount;
      *piVar1 = *piVar1 + 1;
    }
    if (cl_showsecretmessage.Value == true) {
      bVar2 = AActor::CheckLocalView(actor,consoleplayer);
      font = SmallFont;
      if (bVar2) {
        if (printmessage) {
          if ((sectornum < 0) || (showsecretsector.Value == false)) {
            pcVar3 = FStringTable::operator[](&GStrings,"SECRETMESSAGE");
            C_MidPrint(font,pcVar3);
          }
          else {
            pcVar3 = FStringTable::operator[](&GStrings,"SECRETMESSAGE");
            FString::FString(&s,pcVar3);
            FString::AppendFormat(&s," (Sector %d)",(ulong)(uint)sectornum);
            C_MidPrint(SmallFont,s.Chars);
            FString::~FString(&s);
          }
        }
        if (playsound) {
          local_1c.ID = S_FindSound("misc/secret");
          S_Sound(0x20,&local_1c,1.0,1.0);
        }
      }
    }
  }
  level.found_secrets = level.found_secrets + 1;
  return;
}

Assistant:

void P_GiveSecret(AActor *actor, bool printmessage, bool playsound, int sectornum)
{
	if (actor != NULL)
	{
		if (actor->player != NULL)
		{
			actor->player->secretcount++;
		}
		if (cl_showsecretmessage && actor->CheckLocalView(consoleplayer))
		{
			if (printmessage)
			{
				if (!showsecretsector || sectornum < 0) C_MidPrint(SmallFont, GStrings["SECRETMESSAGE"]);
				else
				{
					FString s = GStrings["SECRETMESSAGE"];
					s.AppendFormat(" (Sector %d)", sectornum);
					C_MidPrint(SmallFont, s);
				}
			}
			if (playsound) S_Sound (CHAN_AUTO | CHAN_UI, "misc/secret", 1, ATTN_NORM);
		}
	}
	level.found_secrets++;
}